

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_maps.cpp
# Opt level: O2

double anon_unknown.dwarf_44b8a::get_min(vector<double,_std::allocator<double>_> *ary)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2 = ZEXT816(0x7fefffffffffffff);
  pdVar1 = (ary->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  while (pdVar1 != (ary->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *pdVar1;
    pdVar1 = pdVar1 + 1;
    auVar2 = vminsd_avx(auVar3,auVar2);
  }
  return auVar2._0_8_;
}

Assistant:

inline double get_min(const std::vector<double>& ary) {
    double min = std::numeric_limits<double>::max();
    for (auto v : ary) {
        if (v < min) {
            min = v;
        }
    }
    return min;
}